

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

raw_problem * baryonyx::make_problem(raw_problem *__return_storage_ptr__,context *ctx,istream *is)

{
  bool bVar1;
  raw_problem_status rVar2;
  raw_problem_status local_1640;
  undefined1 local_162c [8];
  raw_problem_status ret;
  problem_parser p;
  stream_buffer sb;
  istream *is_local;
  context *ctx_local;
  
  stream_buffer::stream_buffer((stream_buffer *)&p.m_cache_variable._M_h._M_single_bucket,is);
  problem_parser::problem_parser((problem_parser *)&ret.line);
  rVar2 = parse(ctx,(stream_buffer *)&p.m_cache_variable._M_h._M_single_bucket,
                (problem_parser *)&ret.line);
  local_1640._0_8_ = rVar2._0_8_;
  local_162c._0_4_ = local_1640.tag;
  local_162c._4_4_ = local_1640.line;
  local_1640.column = rVar2.column;
  ret.tag = local_1640.column;
  bVar1 = raw_problem_status::operator_cast_to_bool((raw_problem_status *)local_162c);
  if (bVar1) {
    raw_problem::raw_problem(__return_storage_ptr__,(raw_problem *)&ret.line);
  }
  else {
    raw_problem::raw_problem(__return_storage_ptr__,local_162c._0_4_);
  }
  problem_parser::~problem_parser((problem_parser *)&ret.line);
  return __return_storage_ptr__;
}

Assistant:

raw_problem
make_problem(const context& ctx, std::istream& is) noexcept
{
    stream_buffer sb(is);
    problem_parser p;

    if (auto ret = parse(ctx, sb, p); ret)
        return std::move(p.m_problem);
    else
        return raw_problem(ret.tag);
}